

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

ON_Curve * __thiscall ON_NurbsSurface::IsoCurve(ON_NurbsSurface *this,int dir,double c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ON_NurbsCurve *this_00;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  int j;
  int iVar7;
  int i;
  int iVar8;
  uint uVar9;
  bool bIsRational;
  ON_NurbsCurve N;
  
  if ((uint)dir < 2) {
    this_00 = (ON_NurbsCurve *)0x0;
    iVar1 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[6])(this,0)
    ;
    if ((char)iVar1 != '\0') {
      bIsRational = this->m_is_rat != 0;
      iVar1 = this->m_dim;
      this_00 = (ON_NurbsCurve *)operator_new(0x40);
      ON_NurbsCurve::ON_NurbsCurve
                (this_00,iVar1,bIsRational,this->m_order[(uint)dir],this->m_cv_count[(uint)dir]);
      iVar1 = iVar1 + (uint)bIsRational;
      pdVar4 = this_00->m_knot;
      pdVar5 = this->m_knot[(uint)dir];
      iVar2 = ON_NurbsCurve::KnotCount(this_00);
      memcpy(pdVar4,pdVar5,(long)iVar2 << 3);
      uVar9 = 1 - dir;
      iVar3 = ON_NurbsSpanIndex(this->m_order[uVar9],this->m_cv_count[uVar9],this->m_knot[uVar9],c,1
                                ,0);
      iVar2 = 0;
      if ((-1 < iVar3) && (iVar2 = this->m_cv_count[uVar9] - this->m_order[uVar9], iVar3 < iVar2)) {
        iVar2 = iVar3;
      }
      iVar3 = ON_NurbsCurve::CVCount(this_00);
      ON_NurbsCurve::ON_NurbsCurve(&N,iVar3 * iVar1,false,this->m_order[uVar9],this->m_order[uVar9])
      ;
      pdVar4 = this->m_knot[uVar9];
      iVar3 = ON_NurbsCurve::KnotCount(&N);
      memcpy(N.m_knot,pdVar4 + iVar2,(long)iVar3 << 3);
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      for (iVar3 = 0; iVar3 < N.m_cv_count; iVar3 = iVar3 + 1) {
        pdVar4 = ON_NurbsCurve::CV(&N,iVar3);
        iVar8 = 0;
        iVar7 = this->m_cv_count[(uint)dir];
        if (this->m_cv_count[(uint)dir] < 1) {
          iVar7 = iVar8;
        }
        for (; iVar8 != iVar7; iVar8 = iVar8 + 1) {
          j = iVar3 + iVar2;
          i = iVar8;
          if (dir != 0) {
            j = iVar8;
            i = iVar3 + iVar2;
          }
          pdVar5 = CV(this,i,j);
          for (lVar6 = 0; iVar1 != (int)lVar6; lVar6 = lVar6 + 1) {
            *pdVar4 = pdVar5[lVar6];
            pdVar4 = pdVar4 + 1;
          }
        }
      }
      iVar1 = ON_NurbsCurve::Dimension(&N);
      ON_NurbsCurve::Evaluate(&N,c,0,iVar1,this_00->m_cv,0,(int *)0x0);
      ON_NurbsCurve::~ON_NurbsCurve(&N);
    }
  }
  else {
    this_00 = (ON_NurbsCurve *)0x0;
  }
  return &this_00->super_ON_Curve;
}

Assistant:

ON_Curve* ON_NurbsSurface::IsoCurve(
       int dir,          // 0 first parameter varies and second parameter is constant
                         //   e.g., point on IsoCurve(0,c) at t is srf(t,c)
                         // 1 first parameter is constant and second parameter varies
                         //   e.g., point on IsoCurve(1,c) at t is srf(c,t)
       double c          // value of constant parameter 
       ) const
{
  ON_Curve* crv = 0;
  int i,j,k,Scvsize,span_index;
  double* Ncv;
  const double* Scv;
  if ( (dir == 0 || dir == 1) && IsValid() )
  {
    Scvsize = CVSize();
    ON_NurbsCurve* nurbscrv = new ON_NurbsCurve( m_dim, m_is_rat, m_order[dir], m_cv_count[dir] );
    memcpy( nurbscrv->m_knot, m_knot[dir], nurbscrv->KnotCount()*sizeof(*nurbscrv->m_knot) );
    span_index = ON_NurbsSpanIndex(m_order[1-dir],m_cv_count[1-dir],m_knot[1-dir],c,1,0);
    if ( span_index < 0 )
      span_index = 0;
    else if ( span_index > m_cv_count[1-dir]-m_order[1-dir] )
      span_index = m_cv_count[1-dir]-m_order[1-dir];
    ON_NurbsCurve N( Scvsize*nurbscrv->CVCount(), 0, m_order[1-dir], m_order[1-dir] );
    memcpy( N.m_knot, m_knot[1-dir]+span_index, N.KnotCount()*sizeof(*N.m_knot) );
    for ( i = 0; i < N.m_cv_count; i++ ) {
      Ncv = N.CV(i);
      for ( j = 0; j < m_cv_count[dir]; j++ ) {
        Scv = (dir) ? CV(i+span_index,j) : CV(j,i+span_index);
        for ( k = 0; k < Scvsize; k++ )
          *Ncv++ = *Scv++;
      }
    }
    N.Evaluate( c, 0, N.Dimension(), nurbscrv->m_cv );
    crv = nurbscrv;
  }
  return crv;
}